

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlogging.cpp
# Opt level: O2

void __thiscall QMessagePattern::setPattern(QMessagePattern *this,QString *pattern)

{
  unique_ptr<const_char_*[],_std::default_delete<const_char_*[]>_> *this_00;
  QChar ch;
  char16_t *pcVar1;
  byte bVar2;
  bool bVar3;
  bool bVar4;
  QRegularExpressionMatch QVar5;
  Data *pDVar6;
  pointer __first;
  pointer __last;
  bool bVar7;
  int iVar8;
  pointer __p;
  type ppcVar9;
  reference pvVar10;
  qsizetype qVar11;
  ulong *puVar12;
  type __result;
  QString *formattedMessage;
  ulong uVar13;
  long lVar14;
  ulong uVar15;
  QMessageLogContext *context;
  QList<QString> *this_01;
  ulong uVar16;
  char *pcVar17;
  long in_FS_OFFSET;
  QLatin1StringView s;
  QLatin1StringView s_00;
  QLatin1StringView s_01;
  QLatin1StringView str;
  QLatin1StringView str_00;
  QLatin1StringView str_01;
  qsizetype qStack_170;
  QRegularExpressionMatch m;
  QArrayDataPointer<char16_t> local_118;
  QArrayDataPointer<char16_t> local_f8;
  QArrayDataPointer<char16_t> local_d8;
  vector<std::unique_ptr<const_char[],_std::default_delete<const_char[]>_>,_std::allocator<std::unique_ptr<const_char[],_std::default_delete<const_char[]>_>_>_>
  local_b8;
  QArrayDataPointer<char16_t> local_98;
  QArrayDataPointer<QString> local_78;
  QStringBuilder<QStringBuilder<QLatin1String,_const_QString_&>,_QLatin1Char> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_01 = &this->timeArgs;
  QList<QString>::clear(this_01);
  QList<QMessagePattern::BacktraceParams>::clear(&this->backtraceArgs);
  this->maxBacktraceDepth = 0;
  local_78.size = 0;
  local_98.size = 0;
  local_78.d = (Data *)0x0;
  local_78.ptr = (QString *)0x0;
  local_98.d = (Data *)0x0;
  local_98.ptr = (char16_t *)0x0;
  bVar2 = 0;
  for (uVar16 = 1; uVar13 = (pattern->d).size, uVar16 - 1 < uVar13; uVar16 = uVar16 + 1) {
    pcVar1 = (pattern->d).ptr;
    ch.ucs = pcVar1[uVar16 - 1];
    if ((((!(bool)(ch.ucs != L'%' | bVar2)) && (uVar16 < uVar13)) && (pcVar1[uVar16] == L'{')) &&
       (bVar2 = 1, local_98.size != 0)) {
      QList<QString>::emplaceBack<QString_const&>((QList<QString> *)&local_78,(QString *)&local_98);
      QString::clear((QString *)&local_98);
    }
    QString::append((QString *)&local_98,ch);
    if ((bool)(ch.ucs == L'}' & bVar2)) {
      QList<QString>::emplaceBack<QString_const&>((QList<QString> *)&local_78,(QString *)&local_98);
      QString::clear((QString *)&local_98);
      bVar2 = 0;
    }
  }
  if (local_98.size != 0) {
    QList<QString>::emplaceBack<QString_const&>((QList<QString> *)&local_78,(QString *)&local_98);
  }
  local_b8.
  super__Vector_base<std::unique_ptr<const_char[],_std::default_delete<const_char[]>_>,_std::allocator<std::unique_ptr<const_char[],_std::default_delete<const_char[]>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_b8.
  super__Vector_base<std::unique_ptr<const_char[],_std::default_delete<const_char[]>_>,_std::allocator<std::unique_ptr<const_char[],_std::default_delete<const_char[]>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (unique_ptr<const_char[],_std::default_delete<const_char[]>_> *)0x0;
  local_b8.
  super__Vector_base<std::unique_ptr<const_char[],_std::default_delete<const_char[]>_>,_std::allocator<std::unique_ptr<const_char[],_std::default_delete<const_char[]>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       (unique_ptr<const_char[],_std::default_delete<const_char[]>_> *)0x0;
  __p = (pointer)operator_new__(local_78.size * 8 + 8);
  this_00 = &this->tokens;
  std::__uniq_ptr_impl<const_char_*,_std::default_delete<const_char_*[]>_>::reset
            ((__uniq_ptr_impl<const_char_*,_std::default_delete<const_char_*[]>_> *)this_00,__p);
  ppcVar9 = std::unique_ptr<const_char_*[],_std::default_delete<const_char_*[]>_>::operator[]
                      (this_00,local_78.size);
  *ppcVar9 = (char *)0x0;
  local_d8.size = 0;
  local_d8.d = (Data *)0x0;
  local_d8.ptr = (char16_t *)0x0;
  lVar14 = 0x10;
  uVar16 = 0;
  bVar3 = false;
  bVar4 = false;
  while( true ) {
    if ((ulong)local_78.size <= uVar16) break;
    local_f8.d = *(Data **)((long)local_78.ptr + lVar14 + -0x10);
    local_f8.ptr = *(char16_t **)((long)local_78.ptr + lVar14 + -8);
    local_f8.size = *(long *)((long)&((local_78.ptr)->d).d + lVar14);
    if (local_f8.d != (Data *)0x0) {
      LOCK();
      ((local_f8.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_f8.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    s.m_data = "%{";
    s.m_size = 2;
    bVar7 = QString::startsWith((QString *)&local_f8,s,CaseSensitive);
    if ((bVar7) &&
       (bVar7 = QString::endsWith((QString *)&local_f8,(QChar)0x7d,CaseSensitive), bVar7)) {
      local_58.a.a.m_size = QtPrivate::lengthHelperPointer<char>("%{type}");
      local_58.a.a.m_data = "%{type}";
      bVar7 = ::operator==((QString *)&local_f8,(QLatin1StringView *)&local_58);
      if (bVar7) {
        ppcVar9 = std::unique_ptr<const_char_*[],_std::default_delete<const_char_*[]>_>::operator[]
                            (this_00,uVar16);
        *ppcVar9 = "%{type}";
      }
      else {
        pcVar17 = "%{category}";
        local_58.a.a.m_size = QtPrivate::lengthHelperPointer<char>("%{category}");
        local_58.a.a.m_data = "%{category}";
        bVar7 = ::operator==((QString *)&local_f8,(QLatin1StringView *)&local_58);
        if (!bVar7) {
          pcVar17 = "%{message}";
          local_58.a.a.m_size = QtPrivate::lengthHelperPointer<char>("%{message}");
          local_58.a.a.m_data = "%{message}";
          bVar7 = ::operator==((QString *)&local_f8,(QLatin1StringView *)&local_58);
          if (!bVar7) {
            pcVar17 = "%{file}";
            local_58.a.a.m_size = QtPrivate::lengthHelperPointer<char>("%{file}");
            local_58.a.a.m_data = "%{file}";
            bVar7 = ::operator==((QString *)&local_f8,(QLatin1StringView *)&local_58);
            if (!bVar7) {
              pcVar17 = "%{line}";
              local_58.a.a.m_size = QtPrivate::lengthHelperPointer<char>("%{line}");
              local_58.a.a.m_data = "%{line}";
              bVar7 = ::operator==((QString *)&local_f8,(QLatin1StringView *)&local_58);
              if (!bVar7) {
                pcVar17 = "%{function}";
                local_58.a.a.m_size = QtPrivate::lengthHelperPointer<char>("%{function}");
                local_58.a.a.m_data = "%{function}";
                bVar7 = ::operator==((QString *)&local_f8,(QLatin1StringView *)&local_58);
                if (!bVar7) {
                  pcVar17 = "%{pid}";
                  local_58.a.a.m_size = QtPrivate::lengthHelperPointer<char>("%{pid}");
                  local_58.a.a.m_data = "%{pid}";
                  bVar7 = ::operator==((QString *)&local_f8,(QLatin1StringView *)&local_58);
                  if (!bVar7) {
                    pcVar17 = "%{appname}";
                    local_58.a.a.m_size = QtPrivate::lengthHelperPointer<char>("%{appname}");
                    local_58.a.a.m_data = "%{appname}";
                    bVar7 = ::operator==((QString *)&local_f8,(QLatin1StringView *)&local_58);
                    if (!bVar7) {
                      pcVar17 = "%{threadid}";
                      local_58.a.a.m_size = QtPrivate::lengthHelperPointer<char>("%{threadid}");
                      local_58.a.a.m_data = "%{threadid}";
                      bVar7 = ::operator==((QString *)&local_f8,(QLatin1StringView *)&local_58);
                      if (!bVar7) {
                        pcVar17 = "%{threadname}";
                        local_58.a.a.m_size = QtPrivate::lengthHelperPointer<char>("%{threadname}");
                        local_58.a.a.m_data = "%{threadname}";
                        bVar7 = ::operator==((QString *)&local_f8,(QLatin1StringView *)&local_58);
                        if (!bVar7) {
                          pcVar17 = "%{qthreadptr}";
                          local_58.a.a.m_size =
                               QtPrivate::lengthHelperPointer<char>("%{qthreadptr}");
                          local_58.a.a.m_data = "%{qthreadptr}";
                          bVar7 = ::operator==((QString *)&local_f8,(QLatin1StringView *)&local_58);
                          if (!bVar7) {
                            qVar11 = QtPrivate::lengthHelperPointer<char>("%{time");
                            s_00.m_data = "%{time";
                            s_00.m_size = qVar11;
                            bVar7 = QString::startsWith((QString *)&local_f8,s_00,CaseSensitive);
                            if (bVar7) {
                              ppcVar9 = std::
                                        unique_ptr<const_char_*[],_std::default_delete<const_char_*[]>_>
                                        ::operator[](this_00,uVar16);
                              *ppcVar9 = "%{time";
                              qVar11 = QString::indexOf((QString *)&local_f8,(QChar)0x20,0,
                                                        CaseSensitive);
                              if (qVar11 < 1) {
                                local_58.a.a = (QLatin1String)ZEXT816(0);
                                local_58.a.b = (QString *)0x0;
                                QList<QString>::emplaceBack<QString>(this_01,(QString *)&local_58);
                              }
                              else {
                                QString::mid((QString *)&local_58,(QString *)&local_f8,qVar11 + 1,
                                             (local_f8.size - qVar11) + -2);
                                QList<QString>::emplaceBack<QString>(this_01,(QString *)&local_58);
                              }
                              QArrayDataPointer<char16_t>::~QArrayDataPointer
                                        ((QArrayDataPointer<char16_t> *)&local_58);
                            }
                            else {
                              qVar11 = QtPrivate::lengthHelperPointer<char>("%{backtrace");
                              s_01.m_data = "%{backtrace";
                              s_01.m_size = qVar11;
                              bVar7 = QString::startsWith((QString *)&local_f8,s_01,CaseSensitive);
                              if (bVar7) {
                                ppcVar9 = std::
                                          unique_ptr<const_char_*[],_std::default_delete<const_char_*[]>_>
                                          ::operator[](this_00,uVar16);
                                *ppcVar9 = "%{backtrace";
                                local_58.a.a = (QLatin1String)ZEXT816(0);
                                local_118.d = (Data *)0x0;
                                local_118.ptr = L"|";
                                local_58.a.b = (QString *)0x0;
                                local_118.size = 1;
                                QArrayDataPointer<char16_t>::~QArrayDataPointer
                                          ((QArrayDataPointer<char16_t> *)&local_58);
                                if ((setPattern(QString_const&)::depthRx == '\0') &&
                                   (iVar8 = __cxa_guard_acquire(&setPattern(QString_const&)::depthRx
                                                               ), iVar8 != 0)) {
                                  m.d.d.ptr = (QExplicitlySharedDataPointer<QRegularExpressionMatchPrivate>
                                               )(totally_ordered_wrapper<QRegularExpressionMatchPrivate_*>
                                                 )0x0;
                                  local_58.a.a = (QLatin1String)(ZEXT816(0x463fd0) << 0x40);
                                  local_58.a.b = (QString *)0x1d;
                                  QRegularExpression::QRegularExpression
                                            (&setPattern::depthRx,(QString *)&local_58,
                                             (PatternOptions)0x0);
                                  QArrayDataPointer<char16_t>::~QArrayDataPointer
                                            ((QArrayDataPointer<char16_t> *)&local_58);
                                  QArrayDataPointer<char16_t>::~QArrayDataPointer
                                            ((QArrayDataPointer<char16_t> *)&m);
                                  __cxa_atexit(QRegularExpression::~QRegularExpression,
                                               &setPattern::depthRx,&__dso_handle);
                                  __cxa_guard_release(&setPattern(QString_const&)::depthRx);
                                }
                                if ((setPattern(QString_const&)::separatorRx == '\0') &&
                                   (iVar8 = __cxa_guard_acquire(&setPattern(QString_const&)::
                                                                 separatorRx), iVar8 != 0)) {
                                  m.d.d.ptr = (QExplicitlySharedDataPointer<QRegularExpressionMatchPrivate>
                                               )(totally_ordered_wrapper<QRegularExpressionMatchPrivate_*>
                                                 )0x0;
                                  local_58.a.a = (QLatin1String)(ZEXT816(0x46400c) << 0x40);
                                  local_58.a.b = (QString *)0x21;
                                  QRegularExpression::QRegularExpression
                                            (&setPattern::separatorRx,(QString *)&local_58,
                                             (PatternOptions)0x0);
                                  QArrayDataPointer<char16_t>::~QArrayDataPointer
                                            ((QArrayDataPointer<char16_t> *)&local_58);
                                  QArrayDataPointer<char16_t>::~QArrayDataPointer
                                            ((QArrayDataPointer<char16_t> *)&m);
                                  __cxa_atexit(QRegularExpression::~QRegularExpression,
                                               &setPattern::separatorRx,&__dso_handle);
                                  __cxa_guard_release(&setPattern(QString_const&)::separatorRx);
                                }
                                m.d.d.ptr = (QExplicitlySharedDataPointer<QRegularExpressionMatchPrivate>
                                             )&DAT_aaaaaaaaaaaaaaaa;
                                QRegularExpression::match
                                          ((QRegularExpression *)&m,(QString *)&setPattern::depthRx,
                                           (qsizetype)&local_f8,NormalMatch,(MatchOptions)0x0);
                                bVar7 = QRegularExpressionMatch::hasMatch(&m);
                                iVar8 = 5;
                                if (bVar7) {
                                  local_58.a.a = (QLatin1String)
                                                 QRegularExpressionMatch::capturedView(&m,1);
                                  iVar8 = QStringView::toInt((QStringView *)&local_58,(bool *)0x0,10
                                                            );
                                  if (iVar8 < 1) {
                                    str.m_data = 
                                    "QT_MESSAGE_PATTERN: %{backtrace} depth must be a number greater than 0\n"
                                    ;
                                    str.m_size = 0x47;
                                    QString::append((QString *)&local_d8,str);
                                    iVar8 = 5;
                                  }
                                }
                                QRegularExpression::match
                                          ((QRegularExpression *)&local_58,
                                           (QString *)&setPattern::separatorRx,(qsizetype)&local_f8,
                                           NormalMatch,(MatchOptions)0x0);
                                QVar5 = m;
                                m.d.d.ptr = (QExplicitlySharedDataPointer<QRegularExpressionMatchPrivate>
                                             )(QExplicitlySharedDataPointer<QRegularExpressionMatchPrivate>
                                               )local_58.a.a.m_size;
                                local_58.a.a.m_size = (qsizetype)QVar5.d.d.ptr;
                                QRegularExpressionMatch::~QRegularExpressionMatch
                                          ((QRegularExpressionMatch *)&local_58);
                                bVar7 = QRegularExpressionMatch::hasMatch(&m);
                                if (bVar7) {
                                  QRegularExpressionMatch::captured((QString *)&local_58,&m,1);
                                  qVar11 = local_118.size;
                                  pcVar1 = local_118.ptr;
                                  pDVar6 = local_118.d;
                                  local_118.d = (Data *)local_58.a.a.m_size;
                                  local_118.ptr = (char16_t *)local_58.a.a.m_data;
                                  local_58.a.a.m_size = (qsizetype)pDVar6;
                                  local_58.a.a.m_data = (char *)pcVar1;
                                  local_118.size = (qsizetype)local_58.a.b;
                                  local_58.a.b = (QString *)qVar11;
                                  QArrayDataPointer<char16_t>::~QArrayDataPointer
                                            ((QArrayDataPointer<char16_t> *)&local_58);
                                }
                                local_58.a.a = (QLatin1String)ZEXT816(0);
                                local_58.a.b = (QString *)0x0;
                                local_58._28_4_ = 0xaaaaaaaa;
                                local_58._24_4_ = iVar8;
                                QString::operator=((QString *)&local_58,(QString *)&local_118);
                                QList<QMessagePattern::BacktraceParams>::
                                emplaceBack<QMessagePattern::BacktraceParams_const&>
                                          (&this->backtraceArgs,(BacktraceParams *)&local_58);
                                if (iVar8 < this->maxBacktraceDepth) {
                                  iVar8 = this->maxBacktraceDepth;
                                }
                                this->maxBacktraceDepth = iVar8;
                                QArrayDataPointer<char16_t>::~QArrayDataPointer
                                          ((QArrayDataPointer<char16_t> *)&local_58);
                                QRegularExpressionMatch::~QRegularExpressionMatch(&m);
                                QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_118);
                              }
                              else {
                                pcVar17 = "%{if-category}";
                                local_58.a.a.m_size =
                                     QtPrivate::lengthHelperPointer<char>("%{if-category}");
                                local_58.a.a.m_data = "%{if-category}";
                                bVar7 = ::operator==((QString *)&local_f8,
                                                     (QLatin1StringView *)&local_58);
                                if (bVar7) {
                                  if (bVar3) {
                                    bVar4 = true;
                                  }
LAB_001fff16:
                                  ppcVar9 = std::
                                            unique_ptr<const_char_*[],_std::default_delete<const_char_*[]>_>
                                            ::operator[](this_00,uVar16);
                                  *ppcVar9 = pcVar17;
                                }
                                else {
                                  pcVar17 = "%{if-debug}";
                                  local_58.a.a.m_size =
                                       QtPrivate::lengthHelperPointer<char>("%{if-debug}");
                                  local_58.a.a.m_data = "%{if-debug}";
                                  bVar7 = ::operator==((QString *)&local_f8,
                                                       (QLatin1StringView *)&local_58);
                                  if (bVar7) {
                                    if (bVar3) {
                                      bVar4 = true;
                                    }
                                    goto LAB_001fff16;
                                  }
                                  local_58.a.a.m_size =
                                       QtPrivate::lengthHelperPointer<char>("%{if-info}");
                                  local_58.a.a.m_data = "%{if-info}";
                                  bVar7 = ::operator==((QString *)&local_f8,
                                                       (QLatin1StringView *)&local_58);
                                  if (bVar7) {
                                    if (bVar3) {
                                      bVar4 = true;
                                    }
                                    ppcVar9 = std::
                                              unique_ptr<const_char_*[],_std::default_delete<const_char_*[]>_>
                                              ::operator[](this_00,uVar16);
                                    pcVar17 = "%{if-info}";
                                  }
                                  else {
                                    local_58.a.a.m_size =
                                         QtPrivate::lengthHelperPointer<char>("%{if-warning}");
                                    local_58.a.a.m_data = "%{if-warning}";
                                    bVar7 = ::operator==((QString *)&local_f8,
                                                         (QLatin1StringView *)&local_58);
                                    if (!bVar7) {
                                      local_58.a.a.m_size =
                                           QtPrivate::lengthHelperPointer<char>("%{if-critical}");
                                      local_58.a.a.m_data = "%{if-critical}";
                                      bVar7 = ::operator==((QString *)&local_f8,
                                                           (QLatin1StringView *)&local_58);
                                      if (bVar7) {
                                        if (bVar3) {
                                          bVar4 = true;
                                        }
                                        ppcVar9 = std::
                                                  unique_ptr<const_char_*[],_std::default_delete<const_char_*[]>_>
                                                  ::operator[](this_00,uVar16);
                                        pcVar17 = "%{if-critical}";
                                      }
                                      else {
                                        local_58.a.a.m_size =
                                             QtPrivate::lengthHelperPointer<char>("%{if-fatal}");
                                        local_58.a.a.m_data = "%{if-fatal}";
                                        bVar7 = ::operator==((QString *)&local_f8,
                                                             (QLatin1StringView *)&local_58);
                                        if (!bVar7) {
                                          local_58.a.a.m_size =
                                               QtPrivate::lengthHelperPointer<char>("%{endif}");
                                          local_58.a.a.m_data = "%{endif}";
                                          bVar7 = ::operator==((QString *)&local_f8,
                                                               (QLatin1StringView *)&local_58);
                                          ppcVar9 = std::
                                                  unique_ptr<const_char_*[],_std::default_delete<const_char_*[]>_>
                                                  ::operator[](this_00,uVar16);
                                          if (bVar7) {
                                            *ppcVar9 = "%{endif}";
                                            if ((bVar3) || (bVar4)) {
                                              bVar3 = false;
                                            }
                                            else {
                                              str_00.m_data =
                                                                                                      
                                                  "QT_MESSAGE_PATTERN: %{endif} without an %{if-*}\n"
                                              ;
                                              str_00.m_size = 0x30;
                                              QString::append((QString *)&local_d8,str_00);
                                              bVar3 = false;
                                            }
                                          }
                                          else {
                                            *ppcVar9 = "";
                                            local_58.a.a.m_data =
                                                 "QT_MESSAGE_PATTERN: Unknown placeholder ";
                                            local_58.a.a.m_size = 0x28;
                                            local_58.a.b = (QString *)&local_f8;
                                            local_58.b.ch = '\n';
                                            ::operator+=((QString *)&local_d8,&local_58);
                                          }
                                          goto LAB_001ff91c;
                                        }
                                        if (bVar3) {
                                          bVar4 = true;
                                        }
                                        ppcVar9 = std::
                                                  unique_ptr<const_char_*[],_std::default_delete<const_char_*[]>_>
                                                  ::operator[](this_00,uVar16);
                                        pcVar17 = "%{if-fatal}";
                                      }
                                      *ppcVar9 = pcVar17;
                                      bVar3 = true;
                                      goto LAB_001ff91c;
                                    }
                                    if (bVar3) {
                                      bVar4 = true;
                                    }
                                    ppcVar9 = std::
                                              unique_ptr<const_char_*[],_std::default_delete<const_char_*[]>_>
                                              ::operator[](this_00,uVar16);
                                    pcVar17 = "%{if-warning}";
                                  }
                                  *ppcVar9 = pcVar17;
                                }
                                bVar3 = true;
                              }
                            }
                            goto LAB_001ff91c;
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
        ppcVar9 = std::unique_ptr<const_char_*[],_std::default_delete<const_char_*[]>_>::operator[]
                            (this_00,uVar16);
        *ppcVar9 = pcVar17;
      }
    }
    else {
      QString::toLatin1_helper((QByteArray *)&local_58,(QString *)&local_f8);
      pcVar17 = local_58.a.a.m_data;
      if (local_58.a.a.m_data == (char *)0x0) {
        pcVar17 = &QByteArray::_empty;
      }
      local_118.d = (Data *)qstrdup(pcVar17);
      pvVar10 = std::
                vector<std::unique_ptr<char_const[],std::default_delete<char_const[]>>,std::allocator<std::unique_ptr<char_const[],std::default_delete<char_const[]>>>>
                ::emplace_back<std::unique_ptr<char[],std::default_delete<char[]>>>
                          ((vector<std::unique_ptr<char_const[],std::default_delete<char_const[]>>,std::allocator<std::unique_ptr<char_const[],std::default_delete<char_const[]>>>>
                            *)&local_b8,
                           (unique_ptr<char[],_std::default_delete<char[]>_> *)&local_118);
      pcVar17 = (pvVar10->_M_t).
                super___uniq_ptr_impl<const_char,_std::default_delete<const_char[]>_>._M_t.
                super__Tuple_impl<0UL,_const_char_*,_std::default_delete<const_char[]>_>.
                super__Head_base<0UL,_const_char_*,_false>._M_head_impl;
      ppcVar9 = std::unique_ptr<const_char_*[],_std::default_delete<const_char_*[]>_>::operator[]
                          (this_00,uVar16);
      *ppcVar9 = pcVar17;
      std::unique_ptr<char[],_std::default_delete<char[]>_>::~unique_ptr
                ((unique_ptr<char[],_std::default_delete<char[]>_> *)&local_118);
      QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&local_58);
    }
LAB_001ff91c:
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_f8);
    uVar16 = uVar16 + 1;
    lVar14 = lVar14 + 0x18;
  }
  if (bVar4) {
    pcVar17 = "QT_MESSAGE_PATTERN: %{if-*} cannot be nested\n";
    qStack_170 = 0x2d;
  }
  else {
    if (!bVar3) goto LAB_0020033a;
    pcVar17 = "QT_MESSAGE_PATTERN: missing %{endif}\n";
    qStack_170 = 0x25;
  }
  str_01.m_data = pcVar17;
  str_01.m_size = qStack_170;
  QString::append((QString *)&local_d8,str_01);
LAB_0020033a:
  if (local_d8.size != 0) {
    context = (QMessageLogContext *)0x1;
    QString::chop((QString *)&local_d8,1);
    stderr_message_handler((QtMsgType)&local_d8,context,formattedMessage);
  }
  uVar15 = (long)local_b8.
                 super__Vector_base<std::unique_ptr<const_char[],_std::default_delete<const_char[]>_>,_std::allocator<std::unique_ptr<const_char[],_std::default_delete<const_char[]>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
           (long)local_b8.
                 super__Vector_base<std::unique_ptr<const_char[],_std::default_delete<const_char[]>_>,_std::allocator<std::unique_ptr<const_char[],_std::default_delete<const_char[]>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
  lVar14 = (long)uVar15 >> 3;
  uVar16 = lVar14 + 1;
  lVar14 = lVar14 * 8;
  uVar13 = 0xffffffffffffffff;
  if (lVar14 + 8U < 0xfffffffffffffff8) {
    uVar13 = lVar14 + 0x10;
  }
  puVar12 = (ulong *)operator_new__(-(ulong)(uVar16 >> 0x3d != 0) | uVar13);
  *puVar12 = uVar16;
  if (uVar16 != 0) {
    memset((pointer)(puVar12 + 1),0,(uVar15 & 0xfffffffffffffff8) + 8);
  }
  std::
  __uniq_ptr_impl<std::unique_ptr<const_char[],_std::default_delete<const_char[]>_>,_std::default_delete<std::unique_ptr<const_char[],_std::default_delete<const_char[]>_>[]>_>
  ::reset((__uniq_ptr_impl<std::unique_ptr<const_char[],_std::default_delete<const_char[]>_>,_std::default_delete<std::unique_ptr<const_char[],_std::default_delete<const_char[]>_>[]>_>
           *)this,(pointer)(puVar12 + 1));
  __last = local_b8.
           super__Vector_base<std::unique_ptr<const_char[],_std::default_delete<const_char[]>_>,_std::allocator<std::unique_ptr<const_char[],_std::default_delete<const_char[]>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  __first = local_b8.
            super__Vector_base<std::unique_ptr<const_char[],_std::default_delete<const_char[]>_>,_std::allocator<std::unique_ptr<const_char[],_std::default_delete<const_char[]>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  __result = std::
             unique_ptr<std::unique_ptr<const_char[],_std::default_delete<const_char[]>_>[],_std::default_delete<std::unique_ptr<const_char[],_std::default_delete<const_char[]>_>[]>_>
             ::operator[](&this->literals,0);
  std::__copy_move<true,false,std::random_access_iterator_tag>::
  __copy_m<std::unique_ptr<char_const[],std::default_delete<char_const[]>>*,std::unique_ptr<char_const[],std::default_delete<char_const[]>>*>
            (__first,__last,__result);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_d8);
  std::
  vector<std::unique_ptr<const_char[],_std::default_delete<const_char[]>_>,_std::allocator<std::unique_ptr<const_char[],_std::default_delete<const_char[]>_>_>_>
  ::~vector(&local_b8);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_98);
  QArrayDataPointer<QString>::~QArrayDataPointer(&local_78);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QMessagePattern::setPattern(const QString &pattern)
{
    timeArgs.clear();
#ifdef QLOGGING_HAVE_BACKTRACE
    backtraceArgs.clear();
    maxBacktraceDepth = 0;
#endif

    // scanner
    QList<QString> lexemes;
    QString lexeme;
    bool inPlaceholder = false;
    for (int i = 0; i < pattern.size(); ++i) {
        const QChar c = pattern.at(i);
        if (c == u'%' && !inPlaceholder) {
            if ((i + 1 < pattern.size())
                    && pattern.at(i + 1) == u'{') {
                // beginning of placeholder
                if (!lexeme.isEmpty()) {
                    lexemes.append(lexeme);
                    lexeme.clear();
                }
                inPlaceholder = true;
            }
        }

        lexeme.append(c);

        if (c == u'}' && inPlaceholder) {
            // end of placeholder
            lexemes.append(lexeme);
            lexeme.clear();
            inPlaceholder = false;
        }
    }
    if (!lexeme.isEmpty())
        lexemes.append(lexeme);

    // tokenizer
    std::vector<std::unique_ptr<const char[]>> literalsVar;
    tokens.reset(new const char *[lexemes.size() + 1]);
    tokens[lexemes.size()] = nullptr;

    bool nestedIfError = false;
    bool inIf = false;
    QString error;

    for (int i = 0; i < lexemes.size(); ++i) {
        const QString lexeme = lexemes.at(i);
        if (lexeme.startsWith("%{"_L1) && lexeme.endsWith(u'}')) {
            // placeholder
            if (lexeme == QLatin1StringView(typeTokenC)) {
                tokens[i] = typeTokenC;
            } else if (lexeme == QLatin1StringView(categoryTokenC))
                tokens[i] = categoryTokenC;
            else if (lexeme == QLatin1StringView(messageTokenC))
                tokens[i] = messageTokenC;
            else if (lexeme == QLatin1StringView(fileTokenC))
                tokens[i] = fileTokenC;
            else if (lexeme == QLatin1StringView(lineTokenC))
                tokens[i] = lineTokenC;
            else if (lexeme == QLatin1StringView(functionTokenC))
                tokens[i] = functionTokenC;
            else if (lexeme == QLatin1StringView(pidTokenC))
                tokens[i] = pidTokenC;
            else if (lexeme == QLatin1StringView(appnameTokenC))
                tokens[i] = appnameTokenC;
            else if (lexeme == QLatin1StringView(threadidTokenC))
                tokens[i] = threadidTokenC;
            else if (lexeme == QLatin1StringView(threadnameTokenC))
                tokens[i] = threadnameTokenC;
            else if (lexeme == QLatin1StringView(qthreadptrTokenC))
                tokens[i] = qthreadptrTokenC;
            else if (lexeme.startsWith(QLatin1StringView(timeTokenC))) {
                tokens[i] = timeTokenC;
                qsizetype spaceIdx = lexeme.indexOf(QChar::fromLatin1(' '));
                if (spaceIdx > 0)
                    timeArgs.append(lexeme.mid(spaceIdx + 1, lexeme.size() - spaceIdx - 2));
                else
                    timeArgs.append(QString());
            } else if (lexeme.startsWith(QLatin1StringView(backtraceTokenC))) {
#ifdef QLOGGING_HAVE_BACKTRACE
                tokens[i] = backtraceTokenC;
                QString backtraceSeparator = QStringLiteral("|");
                int backtraceDepth = 5;
                static const QRegularExpression depthRx(QStringLiteral(" depth=(?|\"([^\"]*)\"|([^ }]*))"));
                static const QRegularExpression separatorRx(QStringLiteral(" separator=(?|\"([^\"]*)\"|([^ }]*))"));
                QRegularExpressionMatch m = depthRx.match(lexeme);
                if (m.hasMatch()) {
                    int depth = m.capturedView(1).toInt();
                    if (depth <= 0)
                        error += "QT_MESSAGE_PATTERN: %{backtrace} depth must be a number greater than 0\n"_L1;
                    else
                        backtraceDepth = depth;
                }
                m = separatorRx.match(lexeme);
                if (m.hasMatch())
                    backtraceSeparator = m.captured(1);
                BacktraceParams backtraceParams;
                backtraceParams.backtraceDepth = backtraceDepth;
                backtraceParams.backtraceSeparator = backtraceSeparator;
                backtraceArgs.append(backtraceParams);
                maxBacktraceDepth = qMax(maxBacktraceDepth, backtraceDepth);
#else
                error += "QT_MESSAGE_PATTERN: %{backtrace} is not supported by this Qt build\n"_L1;
                tokens[i] = "";
#endif
            }

#define IF_TOKEN(LEVEL) \
            else if (lexeme == QLatin1StringView(LEVEL)) { \
                if (inIf) \
                    nestedIfError = true; \
                tokens[i] = LEVEL; \
                inIf = true; \
            }
            IF_TOKEN(ifCategoryTokenC)
            IF_TOKEN(ifDebugTokenC)
            IF_TOKEN(ifInfoTokenC)
            IF_TOKEN(ifWarningTokenC)
            IF_TOKEN(ifCriticalTokenC)
            IF_TOKEN(ifFatalTokenC)
#undef IF_TOKEN
            else if (lexeme == QLatin1StringView(endifTokenC)) {
                tokens[i] = endifTokenC;
                if (!inIf && !nestedIfError)
                    error += "QT_MESSAGE_PATTERN: %{endif} without an %{if-*}\n"_L1;
                inIf = false;
            } else {
                tokens[i] = emptyTokenC;
                error += "QT_MESSAGE_PATTERN: Unknown placeholder "_L1 + lexeme + '\n'_L1;
            }
        } else {
            using UP = std::unique_ptr<char[]>;
            tokens[i] = literalsVar.emplace_back(UP(qstrdup(lexeme.toLatin1().constData()))).get();
        }